

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnDelegateExpr
          (ExprVisitorDelegate *this,TryExpr *expr)

{
  int iVar1;
  WatWriter *pWVar2;
  Info local_68;
  
  pWVar2 = this->writer_;
  iVar1 = pWVar2->indent_;
  pWVar2->indent_ = iVar1 + -2;
  if (1 < iVar1) {
    ModuleContext::EndBlock(&pWVar2->super_ModuleContext);
    pWVar2 = this->writer_;
    Opcode::GetInfo(&local_68,(Opcode *)&Opcode::Delegate_Opcode);
    WritePuts(pWVar2,local_68.name,Space);
    WriteVar(this->writer_,&expr->delegate_target,Newline);
    return (Result)Ok;
  }
  __assert_fail("indent_ >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wat-writer.cc"
                ,0xd2,"void wabt::(anonymous namespace)::WatWriter::Dedent()");
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnDelegateExpr(TryExpr* expr) {
  writer_->Dedent();
  writer_->EndBlock();
  writer_->WritePutsSpace(Opcode::Delegate_Opcode.GetName());
  writer_->WriteVar(expr->delegate_target, NextChar::Newline);
  return Result::Ok;
}